

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

Vec_Int_t * Vec_WecCollectFirsts(Vec_Wec_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  undefined4 local_24;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vFirsts;
  Vec_Wec_t *p_local;
  
  iVar1 = Vec_WecSize(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (local_24 = 0; iVar1 = Vec_WecSize(p), local_24 < iVar1; local_24 = local_24 + 1) {
    p_01 = Vec_WecEntry(p,local_24);
    iVar1 = Vec_IntSize(p_01);
    if (0 < iVar1) {
      iVar1 = Vec_IntEntry(p_01,0);
      Vec_IntPush(p_00,iVar1);
    }
  }
  return p_00;
}

Assistant:

static inline Vec_Int_t * Vec_WecCollectFirsts( Vec_Wec_t * p )
{
    Vec_Int_t * vFirsts, * vLevel;
    int i;
    vFirsts = Vec_IntAlloc( Vec_WecSize(p) );
    Vec_WecForEachLevel( p, vLevel, i )
        if ( Vec_IntSize(vLevel) > 0 )
            Vec_IntPush( vFirsts, Vec_IntEntry(vLevel, 0) );
    return vFirsts;
}